

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O2

void __thiscall MockNamedValueList::clear(MockNamedValueList *this)

{
  MockNamedValue *pMVar1;
  MockNamedValueListNode *pMVar2;
  MockNamedValueListNode *mem;
  
  mem = this->head_;
  while (mem != (MockNamedValueListNode *)0x0) {
    pMVar1 = mem->data_;
    pMVar2 = mem->next_;
    if (pMVar1 != (MockNamedValue *)0x0) {
      (*pMVar1->_vptr_MockNamedValue[1])(pMVar1);
      mem = this->head_;
    }
    operator_delete(mem,0x10);
    this->head_ = pMVar2;
    mem = pMVar2;
  }
  return;
}

Assistant:

void MockNamedValueList::clear()
{
    while (head_) {
        MockNamedValueListNode* n = head_->next();
        head_->destroy();
        delete head_;
        head_ = n;
    }
}